

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

ResultValueBase<Catch::clara::detail::ParseState> * __thiscall
Catch::clara::detail::ResultValueBase<Catch::clara::detail::ParseState>::operator=
          (ResultValueBase<Catch::clara::detail::ParseState> *this,
          ResultValueBase<Catch::clara::detail::ParseState> *other)

{
  ResultValueBase<Catch::clara::detail::ParseState> *other_local;
  ResultValueBase<Catch::clara::detail::ParseState> *this_local;
  
  if ((this->super_ResultBase).m_type == Ok) {
    ParseState::~ParseState(&(this->field_0).m_value);
  }
  ResultBase::operator=(&this->super_ResultBase,&other->super_ResultBase);
  if ((this->super_ResultBase).m_type == Ok) {
    ParseState::ParseState(&(this->field_0).m_value,&(other->field_0).m_value);
  }
  return this;
}

Assistant:

auto operator=( ResultValueBase const &other ) -> ResultValueBase & {
            if( m_type == ResultBase::Ok )
                m_value.~T();
            ResultBase::operator=(other);
            if( m_type == ResultBase::Ok )
                new( &m_value ) T( other.m_value );
            return *this;
        }